

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soplex.hpp
# Opt level: O2

number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
* __thiscall
soplex::
SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::objValueReal(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *__return_storage_ptr__,
              SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *this)

{
  double val;
  
  if (this->_status == INFEASIBLE) {
    val = (double)this->_currentSettings->_intParamValues[0] *
          -this->_currentSettings->_realParamValues[6];
  }
  else if (this->_status == UNBOUNDED) {
    val = (double)this->_currentSettings->_intParamValues[0] *
          this->_currentSettings->_realParamValues[6];
  }
  else {
    if ((this->_hasSolReal != false) || ((this->_hasSolRational & 1U) != 0)) {
      _syncRealSolution(this);
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                (&__return_storage_ptr__->m_backend,&(this->_solReal)._objVal.m_backend);
      return __return_storage_ptr__;
    }
    val = 0.0;
  }
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
            (&__return_storage_ptr__->m_backend,val,(type *)0x0);
  return __return_storage_ptr__;
}

Assistant:

R SoPlexBase<R>::objValueReal()
{
   assert(OBJSENSE_MAXIMIZE == 1);
   assert(OBJSENSE_MINIMIZE == -1);

   if(status() == SPxSolverBase<R>::UNBOUNDED)
      return realParam(SoPlexBase<R>::INFTY) * intParam(SoPlexBase<R>::OBJSENSE);
   else if(status() == SPxSolverBase<R>::INFEASIBLE)
      return -realParam(SoPlexBase<R>::INFTY) * intParam(SoPlexBase<R>::OBJSENSE);
   else if(hasSol())
   {
      _syncRealSolution();
      return _solReal._objVal;
   }
   else
      return 0.0;
}